

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::AsymSignInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Session *this_00;
  Token *pTVar6;
  OSObject *key;
  CK_STATE sessionState;
  CK_RV CVar7;
  CryptoFactory *pCVar8;
  SoftHSM *inAsymmetricCryptoOp;
  RSAPrivateKey *privateKey;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar9;
  undefined4 uVar10;
  SoftHSM *pSVar11;
  char *format;
  size_t local_60;
  undefined8 *local_58;
  Type local_4c;
  undefined8 local_48;
  long local_40;
  Token *local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar4 = Session::getOpType(this_00);
  if (iVar4 != 0) {
    return 0x90;
  }
  pTVar6 = Session::getToken(this_00);
  if (pTVar6 == (Token *)0x0) goto LAB_00134825;
  key = (OSObject *)HandleManager::getObject(this->handleManager,hKey);
  if (key == (OSObject *)0x0) {
    return 0x82;
  }
  iVar4 = (*key->_vptr_OSObject[10])(key);
  if ((char)iVar4 == '\0') {
    return 0x82;
  }
  local_38 = pTVar6;
  iVar4 = (*key->_vptr_OSObject[4])(key,1,0);
  iVar5 = (*key->_vptr_OSObject[4])(key,2,1);
  sessionState = Session::getState(this_00);
  CVar7 = haveRead(sessionState,(CK_BBOOL)iVar4,(CK_BBOOL)iVar5);
  if (CVar7 != 0) {
    if (CVar7 == 0x101) {
      softHSMLog(6,"AsymSignInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1011,"User is not authorized");
      return 0x101;
    }
    return CVar7;
  }
  iVar4 = (*key->_vptr_OSObject[4])(key,0x108,0);
  if ((char)iVar4 == '\0') {
    return 0x68;
  }
  bVar3 = isMechanismPermitted(this,key,pMechanism);
  CVar7 = 0x70;
  if (!bVar3) {
    return 0x70;
  }
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x40) {
    bVar3 = false;
    switch(CVar1) {
    case 1:
      local_4c = RSA_PKCS;
      goto LAB_001347a2;
    default:
      return 0x70;
    case 3:
      local_4c = RSA;
      local_58 = (undefined8 *)0x0;
      local_60 = 0;
      goto LAB_001344fc;
    case 5:
      bVar3 = true;
      local_4c = RSA_MD5_PKCS;
      goto LAB_001347a2;
    case 6:
      bVar3 = true;
      local_4c = RSA_SHA1_PKCS;
      goto LAB_001347a2;
    case 0xd:
      plVar2 = (long *)pMechanism->pParameter;
      if ((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) {
        format = "Invalid RSA-PSS parameters";
        iVar4 = 0x105c;
        goto LAB_00134a5b;
      }
      lVar9 = *plVar2;
      if (lVar9 < 0x255) {
        if (lVar9 == 0x220) {
          local_48._0_4_ = 2;
          lVar9 = 1;
          uVar10 = 1;
        }
        else {
          if (lVar9 != 0x250) {
LAB_00134b32:
            format = "Invalid RSA-PSS hash";
            iVar4 = 0x107d;
            goto LAB_00134a5b;
          }
          local_48._0_4_ = 4;
          lVar9 = 2;
          uVar10 = 3;
        }
      }
      else if (lVar9 == 0x255) {
        local_48._0_4_ = 3;
        lVar9 = 5;
        uVar10 = 2;
      }
      else if (lVar9 == 0x260) {
        local_48._0_4_ = 5;
        lVar9 = 3;
        uVar10 = 4;
      }
      else {
        if (lVar9 != 0x270) goto LAB_00134b32;
        local_48._0_4_ = 6;
        lVar9 = 4;
        uVar10 = 5;
      }
      local_48 = CONCAT44(uVar10,(undefined4)local_48);
      if (plVar2[1] != lVar9) {
        format = "Hash and MGF don\'t match";
        iVar4 = 0x1082;
LAB_00134a5b:
        softHSMLog(3,"AsymSignInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,iVar4,format);
        return 7;
      }
      local_40 = plVar2[2];
      local_58 = &local_48;
      local_60 = 0x10;
      local_4c = RSA_PKCS_PSS;
LAB_001344fc:
      bVar3 = false;
      goto LAB_001347b4;
    case 0xe:
      plVar2 = (long *)pMechanism->pParameter;
      if ((((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar2 != 0x220))
         || (plVar2[1] != 1)) {
        format = "Invalid parameters";
        iVar4 = 0x1093;
        goto LAB_00134a5b;
      }
      local_58 = &local_48;
      local_48 = 0x100000002;
      local_40 = plVar2[2];
      bVar3 = true;
      local_60 = 0x10;
      local_4c = RSA_SHA1_PKCS_PSS;
      goto LAB_001347b4;
    case 0x11:
      local_4c = DSA;
      bVar3 = false;
      break;
    case 0x12:
      local_4c = DSA_SHA1;
      bVar3 = true;
      break;
    case 0x13:
      local_4c = DSA_SHA224;
      bVar3 = true;
      break;
    case 0x14:
      local_4c = DSA_SHA256;
      bVar3 = true;
      break;
    case 0x15:
      local_4c = DSA_SHA384;
      bVar3 = true;
      break;
    case 0x16:
      local_4c = DSA_SHA512;
      bVar3 = true;
    }
    pCVar8 = CryptoFactory::i();
    iVar4 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,2);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_01,iVar4);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar11 = inAsymmetricCryptoOp;
    iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    privateKey = (RSAPrivateKey *)CONCAT44(extraout_var_02,iVar4);
    if (privateKey == (RSAPrivateKey *)0x0) goto LAB_00134975;
    CVar7 = getDSAPrivateKey(pSVar11,(DSAPrivateKey *)privateKey,local_38,key);
    if (CVar7 == 0) {
      local_60 = 0;
      local_58 = (undefined8 *)0x0;
      goto LAB_00134830;
    }
    goto LAB_00134804;
  }
  switch(CVar1) {
  case 0x40:
    bVar3 = true;
    local_4c = RSA_SHA256_PKCS;
    goto LAB_001347a2;
  case 0x41:
    bVar3 = true;
    local_4c = RSA_SHA384_PKCS;
    goto LAB_001347a2;
  case 0x42:
    bVar3 = true;
    local_4c = RSA_SHA512_PKCS;
    goto LAB_001347a2;
  case 0x43:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x250 || (plVar2[1] != 2)))) {
      format = "Invalid parameters";
      iVar4 = 0x10b7;
      goto LAB_00134a5b;
    }
    local_58 = &local_48;
    local_48 = 0x300000004;
    local_40 = plVar2[2];
    bVar3 = true;
    local_60 = 0x10;
    local_4c = RSA_SHA256_PKCS_PSS;
    break;
  case 0x44:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x260 || (plVar2[1] != 3)))) {
      format = "Invalid parameters";
      iVar4 = 0x10c9;
      goto LAB_00134a5b;
    }
    local_58 = &local_48;
    local_48 = 0x400000005;
    local_40 = plVar2[2];
    bVar3 = true;
    local_60 = 0x10;
    local_4c = RSA_SHA384_PKCS_PSS;
    break;
  case 0x45:
    plVar2 = (long *)pMechanism->pParameter;
    if ((((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar2 != 0x270)) ||
       (plVar2[1] != 4)) {
      format = "Invalid parameters";
      iVar4 = 0x10db;
      goto LAB_00134a5b;
    }
    local_58 = &local_48;
    local_48 = 0x500000006;
    local_40 = plVar2[2];
    bVar3 = true;
    local_60 = 0x10;
    local_4c = RSA_SHA512_PKCS_PSS;
    break;
  case 0x46:
    bVar3 = true;
    local_4c = RSA_SHA224_PKCS;
LAB_001347a2:
    local_58 = (undefined8 *)0x0;
    local_60 = 0;
    break;
  case 0x47:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x255 || (plVar2[1] != 5)))) {
      format = "Invalid parameters";
      iVar4 = 0x10a5;
      goto LAB_00134a5b;
    }
    local_58 = &local_48;
    local_48 = 0x200000003;
    local_40 = plVar2[2];
    bVar3 = true;
    local_60 = 0x10;
    local_4c = RSA_SHA224_PKCS_PSS;
    break;
  default:
    if (CVar1 == 0x1041) {
      pCVar8 = CryptoFactory::i();
      iVar4 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,5);
      inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_05,iVar4);
      if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
        return 0x70;
      }
      pSVar11 = inAsymmetricCryptoOp;
      iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
      privateKey = (RSAPrivateKey *)CONCAT44(extraout_var_06,iVar4);
      if (privateKey == (RSAPrivateKey *)0x0) goto LAB_00134975;
      CVar7 = getECPrivateKey(pSVar11,(ECPrivateKey *)privateKey,local_38,key);
      if (CVar7 != 0) goto LAB_00134804;
      local_4c = ECDSA;
LAB_001348dd:
      local_58 = (undefined8 *)0x0;
      local_60 = 0;
      goto LAB_001348ef;
    }
    if (CVar1 != 0x1057) {
      return 0x70;
    }
    pCVar8 = CryptoFactory::i();
    iVar4 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,7);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var,iVar4);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar11 = inAsymmetricCryptoOp;
    iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    privateKey = (RSAPrivateKey *)CONCAT44(extraout_var_00,iVar4);
    if (privateKey == (RSAPrivateKey *)0x0) goto LAB_00134975;
    CVar7 = getEDPrivateKey(pSVar11,(EDPrivateKey *)privateKey,local_38,key);
    if (CVar7 == 0) {
      local_4c = EDDSA;
      goto LAB_001348dd;
    }
    goto LAB_00134804;
  }
LAB_001347b4:
  pCVar8 = CryptoFactory::i();
  iVar4 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,1);
  inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_03,iVar4);
  if (inAsymmetricCryptoOp != (SoftHSM *)0x0) {
    pSVar11 = inAsymmetricCryptoOp;
    iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    privateKey = (RSAPrivateKey *)CONCAT44(extraout_var_04,iVar4);
    if (privateKey == (RSAPrivateKey *)0x0) {
LAB_00134975:
      pCVar8 = CryptoFactory::i();
      (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,inAsymmetricCryptoOp);
      CVar7 = 2;
    }
    else {
      CVar7 = getRSAPrivateKey(pSVar11,privateKey,local_38,key);
      if (CVar7 == 0) {
LAB_00134830:
        if (bVar3) {
          iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[3])
                            (inAsymmetricCryptoOp,privateKey,(ulong)local_4c,local_58,local_60);
          bVar3 = true;
          if ((char)iVar4 == '\0') {
            (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1b])(inAsymmetricCryptoOp,privateKey);
            pCVar8 = CryptoFactory::i();
            (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,inAsymmetricCryptoOp);
            return 0x70;
          }
        }
        else {
LAB_001348ef:
          bVar3 = false;
        }
        iVar4 = (*key->_vptr_OSObject[4])(key,0x202,0);
        if ((char)iVar4 != '\0') {
          Session::setReAuthentication(this_00,true);
        }
        Session::setOpType(this_00,5);
        Session::setAsymmetricCryptoOp(this_00,(AsymmetricAlgorithm *)inAsymmetricCryptoOp);
        Session::setMechanism(this_00,local_4c);
        Session::setParameters(this_00,local_58,local_60);
        Session::setAllowMultiPartOp(this_00,bVar3);
        Session::setAllowSinglePartOp(this_00,true);
        Session::setPrivateKey(this_00,&privateKey->super_PrivateKey);
        CVar7 = 0;
      }
      else {
LAB_00134804:
        (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1b])(inAsymmetricCryptoOp,privateKey);
        pCVar8 = CryptoFactory::i();
        (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,inAsymmetricCryptoOp);
LAB_00134825:
        CVar7 = 5;
      }
    }
  }
  return CVar7;
}

Assistant:

CK_RV SoftHSM::AsymSignInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for signing
	if (!key->getBooleanValue(CKA_SIGN, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism = AsymMech::Unknown;
	void* param = NULL;
	size_t paramLen = 0;
	RSA_PKCS_PSS_PARAMS pssParam;
	bool bAllowMultiPartOp;
	bool isRSA = false;
	bool isDSA = false;
#ifdef WITH_ECC
	bool isECDSA = false;
#endif
#ifdef WITH_EDDSA
	bool isEDDSA = false;
#endif
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			mechanism = AsymMech::RSA_PKCS;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			mechanism = AsymMech::RSA;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#ifndef WITH_FIPS
		case CKM_MD5_RSA_PKCS:
			mechanism = AsymMech::RSA_MD5_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA1_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA224_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA256_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA384_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA512_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#ifdef WITH_RAW_PSS
		case CKM_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS))
			{
				ERROR_MSG("Invalid RSA-PSS parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_PKCS_PSS;
			unsigned long allowedMgf;

			switch(CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg) {
				case CKM_SHA_1:
					pssParam.hashAlg = HashAlgo::SHA1;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
					allowedMgf = CKG_MGF1_SHA1;
					break;
				case CKM_SHA224:
					pssParam.hashAlg = HashAlgo::SHA224;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
					allowedMgf = CKG_MGF1_SHA224;
					break;
				case CKM_SHA256:
					pssParam.hashAlg = HashAlgo::SHA256;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
					allowedMgf = CKG_MGF1_SHA256;
					break;
				case CKM_SHA384:
					pssParam.hashAlg = HashAlgo::SHA384;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
					allowedMgf = CKG_MGF1_SHA384;
					break;
				case CKM_SHA512:
					pssParam.hashAlg = HashAlgo::SHA512;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
					allowedMgf = CKG_MGF1_SHA512;
					break;
				default:
					ERROR_MSG("Invalid RSA-PSS hash");
					return CKR_ARGUMENTS_BAD;
			}

			if (CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != allowedMgf) {
				ERROR_MSG("Hash and MGF don't match");
				return CKR_ARGUMENTS_BAD;
			}

			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA_1 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA1_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA1;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA224 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA224_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA224;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA256 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA256_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA256;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA384 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA384_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA384;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA512 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA512_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA512;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_DSA:
			mechanism = AsymMech::DSA;
			bAllowMultiPartOp = false;
			isDSA = true;
			break;
		case CKM_DSA_SHA1:
			mechanism = AsymMech::DSA_SHA1;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA224:
			mechanism = AsymMech::DSA_SHA224;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA256:
			mechanism = AsymMech::DSA_SHA256;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA384:
			mechanism = AsymMech::DSA_SHA384;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA512:
			mechanism = AsymMech::DSA_SHA512;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
#ifdef WITH_ECC
		case CKM_ECDSA:
			mechanism = AsymMech::ECDSA;
			bAllowMultiPartOp = false;
			isECDSA = true;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410:
			mechanism = AsymMech::GOST;
			bAllowMultiPartOp = false;
			break;
		case CKM_GOSTR3410_WITH_GOSTR3411:
			mechanism = AsymMech::GOST_GOST;
			bAllowMultiPartOp = true;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EDDSA:
			mechanism = AsymMech::EDDSA;
			bAllowMultiPartOp = false;
			isEDDSA = true;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PrivateKey* privateKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPrivateKey((RSAPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else if (isDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getDSAPrivateKey((DSAPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
        }
#ifdef WITH_ECC
	else if (isECDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getECPrivateKey((ECPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
#ifdef WITH_EDDSA
	else if (isEDDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getEDPrivateKey((EDPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
	else
	{
#ifdef WITH_GOST
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getGOSTPrivateKey((GOSTPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
#else
		return CKR_MECHANISM_INVALID;
#endif
        }